

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::ProcessOrEnqueue
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,S2CellId id)

{
  bool bVar1;
  S2ShapeIndexCell *index_cell;
  S2CellId id_00;
  S2CellId id_local;
  S2LogMessage local_20;
  
  id_local = id;
  bVar1 = S2CellId::contains(&id_local,
                             (S2CellId)
                             (((this->iter_).iter_._M_t.
                               super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                               .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                              _M_head_impl)->id_).id_);
  if (bVar1) {
    id_00.id_ = (((this->iter_).iter_._M_t.
                  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).
                id_;
    if (id_00.id_ == id_local.id_) {
      index_cell = S2ShapeIndex::Iterator::cell(&this->iter_);
    }
    else {
      index_cell = (S2ShapeIndexCell *)0x0;
      id_00 = id_local;
    }
    ProcessOrEnqueue(this,id_00,index_cell);
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
             ,0x38a,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_20.stream_,"Check failed: id.contains(iter_.id()) ");
  abort();
}

Assistant:

inline void S2ClosestEdgeQueryBase<Distance>::ProcessOrEnqueue(
    S2CellId id) {
  S2_DCHECK(id.contains(iter_.id()));
  if (iter_.id() == id) {
    ProcessOrEnqueue(id, &iter_.cell());
  } else {
    ProcessOrEnqueue(id, nullptr);
  }
}